

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_valueiterator.cpp
# Opt level: O3

Value __thiscall Json::ValueIteratorBase::key(ValueIteratorBase *this)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  long *in_RSI;
  Value VVar3;
  CZString czstring;
  CZString local_28;
  
  Value::CZString::CZString(&local_28,(CZString *)(*in_RSI + 0x20));
  if ((_Base_ptr)local_28.cstr_ == (_Base_ptr)0x0) {
    this->isNull_ = true;
    *(int *)&(this->current_)._M_node = local_28.index_;
  }
  else {
    uVar1 = *(ushort *)&this->isNull_ & 0xfe00;
    if (local_28.index_ == 0) {
      *(ushort *)&this->isNull_ = uVar1 | 4;
      (this->current_)._M_node = (_Base_ptr)local_28.cstr_;
    }
    else {
      *(ushort *)&this->isNull_ = uVar1 | 0x104;
      valueAllocator();
      iVar2 = (*valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                        (valueAllocator::valueAllocator,local_28.cstr_,0xffffffff);
      (this->current_)._M_node = (_Base_ptr)CONCAT44(extraout_var,iVar2);
    }
  }
  Value::CZString::~CZString(&local_28);
  VVar3._8_8_ = extraout_RDX;
  VVar3.value_.map_ = (ObjectValues *)this;
  return VVar3;
}

Assistant:

Value
ValueIteratorBase::key () const
{
    const Value::CZString czstring = (*current_).first;

    if ( czstring.c_str () )
    {
        if ( czstring.isStaticString () )
            return Value ( StaticString ( czstring.c_str () ) );

        return Value ( czstring.c_str () );
    }

    return Value ( czstring.index () );
}